

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_fe241b::IntProColTest::IntProColTest(IntProColTest *this)

{
  __tuple_element_t<2UL,_tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  *pp_Var1;
  __tuple_element_t<3UL,_tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  *pp_Var2;
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffe0;
  int bit_depth;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  AverageTestBase<unsigned_char> *in_stack_fffffffffffffff0;
  
  bit_depth = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  testing::
  WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  ::GetParam();
  std::
  get<0ul,int,int,void(*)(short*,unsigned_char_const*,int,int,int,int),void(*)(short*,unsigned_char_const*,int,int,int,int)>
            ((tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
              *)0xa46420);
  testing::
  WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  ::GetParam();
  std::
  get<1ul,int,int,void(*)(short*,unsigned_char_const*,int,int,int,int),void(*)(short*,unsigned_char_const*,int,int,int,int)>
            ((tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
              *)0xa46433);
  AverageTestBase<unsigned_char>::AverageTestBase
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,bit_depth
            );
  testing::
  WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  ::WithParamInterface
            ((WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
              *)(in_RDI + 6));
  *in_RDI = &PTR__IntProColTest_01f96788;
  in_RDI[6] = &PTR__IntProColTest_01f967c8;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  testing::
  WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  ::GetParam();
  pp_Var1 = std::
            get<2ul,int,int,void(*)(short*,unsigned_char_const*,int,int,int,int),void(*)(short*,unsigned_char_const*,int,int,int,int)>
                      ((tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
                        *)0xa46496);
  in_RDI[7] = *pp_Var1;
  testing::
  WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  ::GetParam();
  pp_Var2 = std::
            get<3ul,int,int,void(*)(short*,unsigned_char_const*,int,int,int,int),void(*)(short*,unsigned_char_const*,int,int,int,int)>
                      ((tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
                        *)0xa464b9);
  in_RDI[8] = *pp_Var2;
  return;
}

Assistant:

IntProColTest()
      : AverageTestBase(GET_PARAM(0), GET_PARAM(1)), vbuf_asm_(nullptr),
        vbuf_c_(nullptr) {
    asm_func_ = GET_PARAM(2);
    c_func_ = GET_PARAM(3);
  }